

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

wchar_t find_inven(object *obj)

{
  _Bool _Var1;
  wchar_t local_2c;
  object *poStack_28;
  wchar_t num;
  object *gear_obj;
  wchar_t i;
  object *obj_local;
  
  local_2c = L'\0';
  poStack_28 = player->gear;
  do {
    if (poStack_28 == (object *)0x0) {
      return local_2c;
    }
    _Var1 = object_is_equipped(player->body,poStack_28);
    if ((!_Var1) && (obj->kind == poStack_28->kind)) {
      switch(obj->tval) {
      case '\x01':
        return L'\0';
      case '\x02':
      case '\x03':
      case '\x04':
      case '\x05':
      case '\x06':
      case '\a':
      case '\b':
      case '\t':
      case '\n':
      case '\v':
      case '\f':
      case '\r':
      case '\x0e':
      case '\x0f':
      case '\x10':
      case '\x11':
      case '\x12':
      case '\x13':
      case '\x14':
      case '\x15':
        if (((obj->to_h == poStack_28->to_h) && (obj->to_d == poStack_28->to_d)) &&
           (obj->to_a == poStack_28->to_a)) {
          for (gear_obj._4_4_ = 0; gear_obj._4_4_ < 0x10; gear_obj._4_4_ = gear_obj._4_4_ + 1) {
          }
          if (((((obj->artifact == poStack_28->artifact) && (obj->ego == poStack_28->ego)) &&
               ((obj->timeout == poStack_28->timeout || (_Var1 = tval_is_light(obj), !_Var1)))) &&
              ((obj->ac == poStack_28->ac && (obj->dd == poStack_28->dd)))) &&
             (obj->ds == poStack_28->ds)) break;
        }
        goto LAB_001fc9ad;
      case '\x16':
      case '\x17':
        break;
      case '\x18':
        break;
      case '\x19':
      case '\x1a':
      case '\x1c':
      case '\x1d':
        break;
      default:
      }
      _Var1 = flag_is_equal(obj->flags,poStack_28->flags,5);
      if (_Var1) {
        local_2c = (uint)poStack_28->number + local_2c;
      }
    }
LAB_001fc9ad:
    poStack_28 = poStack_28->next;
  } while( true );
}

Assistant:

int find_inven(const struct object *obj)
{
	int i;
	struct object *gear_obj;
	int num = 0;

	/* Similar slot? */
	for (gear_obj = player->gear; gear_obj; gear_obj = gear_obj->next) {
		/* Check only the inventory and the quiver */
		if (object_is_equipped(player->body, gear_obj))
			continue;

		/* Require identical object types */
		if (obj->kind != gear_obj->kind)
			continue;

		/* Analyze the items */
		switch (obj->tval)
		{
			/* Chests */
			case TV_CHEST:
			{
				/* Never okay */
				return 0;
			}

			/* Food and Potions and Scrolls */
			case TV_FOOD:
			case TV_MUSHROOM:
			case TV_POTION:
			case TV_SCROLL:
			{
				/* Assume okay */
				break;
			}

			/* Staves and Wands */
			case TV_STAFF:
			case TV_WAND:
			{
				/* Assume okay */
				break;
			}

			/* Rods */
			case TV_ROD:
			{
				/* Assume okay */
				break;
			}

			/* Wearables */
			case TV_BOW:
			case TV_DIGGING:
			case TV_HAFTED:
			case TV_POLEARM:
			case TV_SWORD:
			case TV_BOOTS:
			case TV_GLOVES:
			case TV_HELM:
			case TV_CROWN:
			case TV_SHIELD:
			case TV_CLOAK:
			case TV_SOFT_ARMOR:
			case TV_HARD_ARMOR:
			case TV_DRAG_ARMOR:
			case TV_RING:
			case TV_AMULET:
			case TV_LIGHT:
			case TV_BOLT:
			case TV_ARROW:
			case TV_SHOT:
			{
				/* Require identical "bonuses" */
				if (obj->to_h != gear_obj->to_h)
					continue;
				if (obj->to_d != gear_obj->to_d)
					continue;
				if (obj->to_a != gear_obj->to_a)
					continue;

				/* Require identical modifiers */
				for (i = 0; i < OBJ_MOD_MAX; i++)
					if (obj->modifiers[i] != gear_obj->modifiers[i])
						continue;

				/* Require identical "artifact" names */
				if (obj->artifact != gear_obj->artifact)
					continue;

				/* Require identical "ego-item" names */
				if (obj->ego != gear_obj->ego)
					continue;

				/* Lights must have same amount of fuel */
				else if (obj->timeout != gear_obj->timeout &&
						 tval_is_light(obj))
					continue;

				/* Require identical "values" */
				if (obj->ac != gear_obj->ac)
					continue;
				if (obj->dd != gear_obj->dd)
					continue;
				if (obj->ds != gear_obj->ds)
					continue;

				/* Probably okay */
				break;
			}

			/* Various */
			default:
			{
				/* Probably okay */
				break;
			}
		}


		/* Different flags */
		if (!of_is_equal(obj->flags, gear_obj->flags))
			continue;

		/* They match, so add up */
		num += gear_obj->number;
	}

	return num;
}